

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

PragmaName * pragmaLocate(char *zName)

{
  PragmaName *pPVar1;
  byte bVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  
  iVar5 = 0x41;
  iVar7 = 0;
  do {
    iVar8 = (iVar5 + iVar7) / 2;
    pPVar1 = aPragmaName + iVar8;
    pcVar3 = pPVar1->zName;
    if (zName == (char *)0x0) {
      iVar6 = -(uint)(pcVar3 != (char *)0x0);
LAB_0014f45d:
      if (iVar6 == 0) {
        return pPVar1;
      }
    }
    else {
      if (pcVar3 != (char *)0x0) {
        lVar9 = 0;
        do {
          bVar2 = zName[lVar9];
          if (bVar2 == pcVar3[lVar9]) {
            if ((ulong)bVar2 == 0) {
              return pPVar1;
            }
          }
          else {
            iVar6 = (uint)""[bVar2] - (uint)""[(byte)pcVar3[lVar9]];
            if (iVar6 != 0) goto LAB_0014f45d;
          }
          lVar9 = lVar9 + 1;
        } while( true );
      }
      iVar6 = 1;
    }
    iVar4 = iVar8 + 1;
    if (iVar6 < 0) {
      iVar5 = iVar8 + -1;
      iVar4 = iVar7;
    }
    iVar7 = iVar4;
    if (iVar5 < iVar7) {
      return (PragmaName *)0x0;
    }
  } while( true );
}

Assistant:

static const PragmaName *pragmaLocate(const char *zName){
  int upr, lwr, mid = 0, rc;
  lwr = 0;
  upr = ArraySize(aPragmaName)-1;
  while( lwr<=upr ){
    mid = (lwr+upr)/2;
    rc = sqlite3_stricmp(zName, aPragmaName[mid].zName);
    if( rc==0 ) break;
    if( rc<0 ){
      upr = mid - 1;
    }else{
      lwr = mid + 1;
    }
  }
  return lwr>upr ? 0 : &aPragmaName[mid];
}